

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O0

void __thiscall xmrig::FailoverStrategy::onLoginSuccess(FailoverStrategy *this)

{
  IClient *in_stack_00000028;
  FailoverStrategy *in_stack_00000030;
  
  onLoginSuccess(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void xmrig::FailoverStrategy::onLoginSuccess(IClient *client)
{
    int active = m_active;

    if (client->id() == 0 || !isActive()) {
        active = client->id();
    }

    for (size_t i = 1; i < m_pools.size(); ++i) {
        if (active != static_cast<int>(i)) {
            m_pools[i]->disconnect();
        }
    }

    if (active >= 0 && active != m_active) {
        m_index = m_active = active;
        m_listener->onActive(this, client);
    }
}